

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O2

int point_mul_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  char cVar1;
  int iVar2;
  int iVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  long lVar6;
  pt_prj_t_conflict2 *ppVar7;
  int iVar8;
  uint uVar9;
  uint64_t *puVar10;
  pt_prj_t_conflict2 *ppVar11;
  uint64_t *puVar12;
  long lVar13;
  bool bVar14;
  byte bVar15;
  uchar b_y [64];
  uchar b_x [64];
  uchar b_m [64];
  pt_prj_t_conflict2 lut;
  pt_aff_t_conflict2 local_1138;
  pt_prj_t_conflict2 Q;
  int8_t rnaf [103];
  pt_prj_t_conflict2 local_f38 [16];
  
  bVar15 = 0;
  BN_CTX_start((BN_CTX *)ctx);
  pBVar4 = BN_CTX_get((BN_CTX *)ctx);
  pBVar5 = BN_CTX_get((BN_CTX *)ctx);
  iVar3 = 0;
  iVar8 = 0;
  if ((((pBVar5 != (BIGNUM *)0x0) &&
       (iVar2 = EC_POINT_get_affine_coordinates(group,q,pBVar4,pBVar5,ctx), iVar2 != 0)) &&
      (iVar2 = BN_bn2lebinpad(pBVar4,b_x,0x40), iVar8 = iVar3, iVar2 == 0x40)) &&
     ((iVar3 = BN_bn2lebinpad(pBVar5,b_y,0x40), iVar3 == 0x40 &&
      (iVar3 = BN_bn2lebinpad(m,b_m,0x40), iVar3 == 0x40)))) {
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_1138.X,b_x);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_from_bytes(local_1138.Y,b_y);
    rnaf[0x50] = '\0';
    rnaf[0x51] = '\0';
    rnaf[0x52] = '\0';
    rnaf[0x53] = '\0';
    rnaf[0x54] = '\0';
    rnaf[0x55] = '\0';
    rnaf[0x56] = '\0';
    rnaf[0x57] = '\0';
    rnaf[0x58] = '\0';
    rnaf[0x59] = '\0';
    rnaf[0x5a] = '\0';
    rnaf[0x5b] = '\0';
    rnaf[0x5c] = '\0';
    rnaf[0x5d] = '\0';
    rnaf[0x5e] = '\0';
    rnaf[0x40] = '\0';
    rnaf[0x41] = '\0';
    rnaf[0x42] = '\0';
    rnaf[0x43] = '\0';
    rnaf[0x44] = '\0';
    rnaf[0x45] = '\0';
    rnaf[0x46] = '\0';
    rnaf[0x47] = '\0';
    rnaf[0x48] = '\0';
    rnaf[0x49] = '\0';
    rnaf[0x4a] = '\0';
    rnaf[0x4b] = '\0';
    rnaf[0x4c] = '\0';
    rnaf[0x4d] = '\0';
    rnaf[0x4e] = '\0';
    rnaf[0x4f] = '\0';
    rnaf[0x30] = '\0';
    rnaf[0x31] = '\0';
    rnaf[0x32] = '\0';
    rnaf[0x33] = '\0';
    rnaf[0x34] = '\0';
    rnaf[0x35] = '\0';
    rnaf[0x36] = '\0';
    rnaf[0x37] = '\0';
    rnaf[0x38] = '\0';
    rnaf[0x39] = '\0';
    rnaf[0x3a] = '\0';
    rnaf[0x3b] = '\0';
    rnaf[0x3c] = '\0';
    rnaf[0x3d] = '\0';
    rnaf[0x3e] = '\0';
    rnaf[0x3f] = '\0';
    rnaf[0x20] = '\0';
    rnaf[0x21] = '\0';
    rnaf[0x22] = '\0';
    rnaf[0x23] = '\0';
    rnaf[0x24] = '\0';
    rnaf[0x25] = '\0';
    rnaf[0x26] = '\0';
    rnaf[0x27] = '\0';
    rnaf[0x28] = '\0';
    rnaf[0x29] = '\0';
    rnaf[0x2a] = '\0';
    rnaf[0x2b] = '\0';
    rnaf[0x2c] = '\0';
    rnaf[0x2d] = '\0';
    rnaf[0x2e] = '\0';
    rnaf[0x2f] = '\0';
    rnaf[0x10] = '\0';
    rnaf[0x11] = '\0';
    rnaf[0x12] = '\0';
    rnaf[0x13] = '\0';
    rnaf[0x14] = '\0';
    rnaf[0x15] = '\0';
    rnaf[0x16] = '\0';
    rnaf[0x17] = '\0';
    rnaf[0x18] = '\0';
    rnaf[0x19] = '\0';
    rnaf[0x1a] = '\0';
    rnaf[0x1b] = '\0';
    rnaf[0x1c] = '\0';
    rnaf[0x1d] = '\0';
    rnaf[0x1e] = '\0';
    rnaf[0x1f] = '\0';
    rnaf[0] = '\0';
    rnaf[1] = '\0';
    rnaf[2] = '\0';
    rnaf[3] = '\0';
    rnaf[4] = '\0';
    rnaf[5] = '\0';
    rnaf[6] = '\0';
    rnaf[7] = '\0';
    rnaf[8] = '\0';
    rnaf[9] = '\0';
    rnaf[10] = '\0';
    rnaf[0xb] = '\0';
    rnaf[0xc] = '\0';
    rnaf[0xd] = '\0';
    rnaf[0xe] = '\0';
    rnaf[0xf] = '\0';
    rnaf[0x5f] = '\0';
    rnaf[0x60] = '\0';
    rnaf[0x61] = '\0';
    rnaf[0x62] = '\0';
    rnaf[99] = '\0';
    rnaf[100] = '\0';
    rnaf[0x65] = '\0';
    rnaf[0x66] = '\0';
    memset(&Q,0,0xf0);
    memset(&lut,0,0xf0);
    ppVar7 = local_f38;
    precomp_wnaf(ppVar7,&local_1138);
    scalar_rwnaf(rnaf,b_m);
    iVar8 = (int)rnaf[0x66];
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
      bVar14 = (int)(iVar8 + -1 >> 1 ^ (uint)lVar13) < 1;
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(Q.X,bVar14,Q.X,ppVar7->X);
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(Q.Y,bVar14,Q.Y,ppVar7->Y);
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(Q.Z,bVar14,Q.Z,ppVar7->Z);
      ppVar7 = ppVar7 + 1;
    }
    for (uVar9 = 0x65; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
      iVar8 = 5;
      while (bVar14 = iVar8 != 0, iVar8 = iVar8 + -1, bVar14) {
        point_double(&Q,&Q);
      }
      cVar1 = rnaf[uVar9];
      ppVar7 = local_f38;
      for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
        bVar14 = (int)((int)(char)(-1 - (cVar1 >> 7)) + ((int)cVar1 >> 0x1f ^ (int)cVar1) >> 1 ^
                      (uint)lVar13) < 1;
        fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(lut.X,bVar14,lut.X,ppVar7->X);
        fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(lut.Y,bVar14,lut.Y,ppVar7->Y);
        fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(lut.Z,bVar14,lut.Z,ppVar7->Z);
        ppVar7 = ppVar7 + 1;
      }
      puVar10 = lut.Y;
      fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(local_1138.Y,puVar10);
      fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz
                (puVar10,(byte)(cVar1 >> 7) >> 7,puVar10,local_1138.Y);
      point_add_proj(&Q,&Q,&lut);
    }
    lVar13 = 10;
    ppVar7 = local_f38;
    ppVar11 = &lut;
    for (lVar6 = lVar13; lVar6 != 0; lVar6 = lVar6 + -1) {
      ppVar11->X[0] = ppVar7->X[0];
      ppVar7 = (pt_prj_t_conflict2 *)((long)ppVar7 + ((ulong)bVar15 * -2 + 1) * 8);
      ppVar11 = (pt_prj_t_conflict2 *)((long)ppVar11 + (ulong)bVar15 * -0x10 + 8);
    }
    fiat_id_tc26_gost_3410_2012_512_paramSetA_opp(lut.Y,local_f38[0].Y);
    puVar10 = local_f38[0].Z;
    puVar12 = lut.Z;
    for (; lVar13 != 0; lVar13 = lVar13 + -1) {
      *puVar12 = *puVar10;
      puVar10 = puVar10 + (ulong)bVar15 * -2 + 1;
      puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
    }
    point_add_proj(&lut,&lut,&Q);
    bVar15 = b_m[0] & 1;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(Q.X,bVar15,lut.X,Q.X);
    puVar10 = Q.Y;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar10,bVar15,lut.Y,puVar10);
    puVar12 = Q.Z;
    fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(puVar12,bVar15,lut.Z,puVar12);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_inv(puVar12,puVar12);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_1138.X,Q.X,puVar12);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(local_1138.Y,puVar10,puVar12);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(b_x,local_1138.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetA_to_bytes(b_y,local_1138.Y);
    iVar8 = CRYPTO_memcmp("",b_x,0x40);
    if ((iVar8 == 0) && (iVar8 = CRYPTO_memcmp("",b_y,0x40), iVar8 == 0)) {
      iVar8 = EC_POINT_set_to_infinity((EC_GROUP *)group,(EC_POINT *)r);
      if (iVar8 == 0) {
        iVar8 = 0;
        goto LAB_001313e9;
      }
    }
    else {
      lVar13 = BN_lebin2bn(b_x,0x40,pBVar4);
      iVar8 = 0;
      if ((lVar13 == 0) ||
         ((lVar13 = BN_lebin2bn(b_y,0x40,pBVar5), lVar13 == 0 ||
          (iVar3 = EC_POINT_set_affine_coordinates(group,r,pBVar4,pBVar5,ctx), iVar3 == 0))))
      goto LAB_001313e9;
    }
    iVar8 = 1;
  }
LAB_001313e9:
  BN_CTX_end((BN_CTX *)ctx);
  return iVar8;
}

Assistant:

int
    point_mul_id_tc26_gost_3410_2012_512_paramSetA(const EC_GROUP *group,
                                                   EC_POINT *r,
                                                   const EC_POINT *q,
                                                   const BIGNUM *m,
                                                   BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the variable scalar multiplication */
    point_mul(b_x, b_y, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}